

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Push
          (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,iterator it,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  iterator iVar1;
  iterator iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  iterator it_local;
  
  pcStack_40 = (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)it.Position;
  local_48 = it.Tree;
  local_38 = t;
  t_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_local = local_48;
  it_local.Tree = pcStack_40;
  std::__cxx11::string::string((string *)&local_68,(string *)t);
  iVar2.Position = (PositionType)pcStack_40;
  iVar2.Tree = local_48;
  iVar2 = Push_impl(this,iVar2,&local_68);
  it_local.Position = (PositionType)iVar2.Tree;
  std::__cxx11::string::~string((string *)&local_68);
  iVar1.Position = iVar2.Position;
  iVar1.Tree = (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)it_local.Position;
  return iVar1;
}

Assistant:

iterator Push(iterator it, T t) { return Push_impl(it, t); }